

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::handleWrite(TcpConnection *this)

{
  EventLoop *this_00;
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  sz_fd sVar4;
  pointer pCVar5;
  size_t sVar6;
  char *buf;
  LogStream *pLVar7;
  self *this_01;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_2048 [12];
  Logger local_2038;
  undefined1 local_1068 [12];
  Logger local_1058;
  enable_shared_from_this<sznet::net::TcpConnection> local_78;
  type local_68;
  Functor local_38;
  size_t local_18;
  sz_ssize_t n;
  TcpConnection *this_local;
  
  n = (sz_ssize_t)this;
  EventLoop::assertInLoopThread(this->m_loop);
  pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_channel);
  bVar1 = Channel::isWriting(pCVar5);
  if (bVar1) {
    local_18 = 0;
    while (sVar6 = Buffer::readableBytes(&this->m_outputBuffer), sVar6 != 0) {
      do {
        pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
                 operator->(&this->m_channel);
        sVar4 = Channel::fd(pCVar5);
        buf = Buffer::peek(&this->m_outputBuffer);
        sVar6 = Buffer::readableBytes(&this->m_outputBuffer);
        local_18 = sockets::sz_socket_write(sVar4,buf,sVar6);
        bVar1 = false;
        if (local_18 == 0xffffffffffffffff) {
          iVar2 = sz_getlasterr();
          bVar1 = iVar2 == 4;
        }
      } while (bVar1);
      if ((long)local_18 < 1) {
        bVar1 = sockets::sz_wouldblock();
        if (bVar1) {
          return;
        }
        Logger::SourceFile::SourceFile<104>
                  ((SourceFile *)local_1068,
                   (char (*) [104])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                  );
        file._12_4_ = 0;
        file.m_data = (char *)local_1068._0_8_;
        file.m_size = local_1068._8_4_;
        Logger::Logger(&local_1058,file,0x185,false);
        pLVar7 = Logger::stream(&local_1058);
        LogStream::operator<<(pLVar7,"TcpConnection::handleWrite");
        Logger::~Logger(&local_1058);
        handleError(this);
        handleClose(this);
        return;
      }
      (this->m_netStatInfo).m_sendBytes = local_18 + (this->m_netStatInfo).m_sendBytes;
      Buffer::retrieve(&this->m_outputBuffer,local_18);
      sVar6 = Buffer::readableBytes(&this->m_outputBuffer);
      if (sVar6 == 0) {
        pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
                 operator->(&this->m_channel);
        Channel::disableWriting(pCVar5);
        bVar1 = std::function::operator_cast_to_bool((function *)&this->m_writeCompleteCallback);
        if (bVar1) {
          this_00 = this->m_loop;
          std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(&local_78);
          std::
          bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>&,std::shared_ptr<sznet::net::TcpConnection>>
                    (&local_68,&this->m_writeCompleteCallback,
                     (shared_ptr<sznet::net::TcpConnection> *)&local_78);
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                    ((function<void()> *)&local_38,&local_68);
          EventLoop::queueInLoop(this_00,&local_38);
          std::function<void_()>::~function(&local_38);
          std::
          _Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
          ::~_Bind(&local_68);
          std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
                    ((shared_ptr<sznet::net::TcpConnection> *)&local_78);
        }
        if (this->m_state == kDisconnecting) {
          shutdownInLoop(this);
        }
      }
    }
  }
  else {
    LVar3 = Logger::logLevel();
    if ((int)LVar3 < 1) {
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_2048,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2048._0_8_;
      file_00.m_size = local_2048._8_4_;
      Logger::Logger(&local_2038,file_00,399,TRACE,"handleWrite");
      pLVar7 = Logger::stream(&local_2038);
      this_01 = LogStream::operator<<(pLVar7,"Connection fd = ");
      pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
               operator->(&this->m_channel);
      sVar4 = Channel::fd(pCVar5);
      pLVar7 = LogStream::operator<<(this_01,sVar4);
      LogStream::operator<<(pLVar7," is down, no more writing");
      Logger::~Logger(&local_2038);
    }
  }
  return;
}

Assistant:

void TcpConnection::handleWrite()
{
	m_loop->assertInLoopThread();
	if (m_channel->isWriting())
	{
		sz_ssize_t n = 0;
		while(m_outputBuffer.readableBytes() > 0)
		{
			do
			{
				n = sockets::sz_socket_write(m_channel->fd(), m_outputBuffer.peek(), m_outputBuffer.readableBytes());
			} while (n == -1 && sz_getlasterr() == sz_err_eintr);
			if (n > 0)
			{
				m_netStatInfo.m_sendBytes += n;
				m_outputBuffer.retrieve(n);
				if (m_outputBuffer.readableBytes() == 0)
				{
					m_channel->disableWriting();
					if (m_writeCompleteCallback)
					{
						m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
					}
					if (m_state == kDisconnecting)
					{
						shutdownInLoop();
					}
				}
			}
			else
			{
				if (!sockets::sz_wouldblock())
				{
					LOG_SYSERR << "TcpConnection::handleWrite";
					handleError();
					handleClose();
				}
				return;
			}
		}
	}
	else
	{
		LOG_TRACE << "Connection fd = " << m_channel->fd()
			<< " is down, no more writing";
	}
}